

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

int Bac_ObjName(Bac_Ntk_t *p,int i)

{
  int iVar1;
  
  iVar1 = Bac_ObjIsCo(p,i);
  if (iVar1 != 0) {
    i = Bac_ObjFanin(p,i);
  }
  iVar1 = Bac_ObjNameInt(p,i);
  return iVar1;
}

Assistant:

static inline int            Bac_ObjName( Bac_Ntk_t * p, int i )             { return Bac_ObjIsCo(p, i) ? Bac_ObjNameInt(p, Bac_ObjFanin(p,i)) : Bac_ObjNameInt(p, i);     }